

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void fmt::v5::internal::handle_float_type_spec<fmt::v5::float_spec_handler&>
               (char spec,float_spec_handler *handler)

{
  float_spec_handler *in_RSI;
  char in_DIL;
  float_spec_handler *unaff_retaddr;
  
  if (in_DIL != '\0') {
    if (in_DIL == 'A') {
LAB_001ccacb:
      float_spec_handler::on_hex(in_RSI);
      return;
    }
    if (in_DIL == 'E') {
LAB_001ccab3:
      float_spec_handler::on_exp(in_RSI);
      return;
    }
    if (in_DIL == 'F') {
LAB_001ccabf:
      float_spec_handler::on_fixed(in_RSI);
      return;
    }
    if (in_DIL != 'G') {
      if (in_DIL == 'a') goto LAB_001ccacb;
      if (in_DIL == 'e') goto LAB_001ccab3;
      if (in_DIL == 'f') goto LAB_001ccabf;
      if (in_DIL != 'g') {
        float_spec_handler::on_error(unaff_retaddr);
        return;
      }
    }
  }
  float_spec_handler::on_general(in_RSI);
  return;
}

Assistant:

FMT_CONSTEXPR void handle_float_type_spec(char spec, Handler &&handler) {
  switch (spec) {
  case 0: case 'g': case 'G':
    handler.on_general();
    break;
  case 'e': case 'E':
    handler.on_exp();
    break;
  case 'f': case 'F':
    handler.on_fixed();
    break;
   case 'a': case 'A':
    handler.on_hex();
    break;
  default:
    handler.on_error();
    break;
  }
}